

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbedding.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::WordEmbedding::SerializeWithCachedSizes
          (WordEmbedding *this,CodedOutputStream *output)

{
  uint32 uVar1;
  int size;
  long lVar2;
  char *data;
  string *psVar3;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  WordEmbedding *this_local;
  
  uVar1 = revision(this);
  if (uVar1 != 0) {
    uVar1 = revision(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,uVar1,output);
  }
  language_abi_cxx11_(this);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    language_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    language_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,"CoreML.Specification.CoreMLModels.WordEmbedding.language");
    psVar3 = language_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(10,psVar3,output);
  }
  modelparameterdata_abi_cxx11_(this);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    psVar3 = modelparameterdata_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(100,psVar3,output);
  }
  return;
}

Assistant:

void WordEmbedding::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CoreMLModels.WordEmbedding)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 revision = 1;
  if (this->revision() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->revision(), output);
  }

  // string language = 10;
  if (this->language().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->language().data(), this->language().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CoreMLModels.WordEmbedding.language");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      10, this->language(), output);
  }

  // bytes modelParameterData = 100;
  if (this->modelparameterdata().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      100, this->modelparameterdata(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CoreMLModels.WordEmbedding)
}